

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O1

int __thiscall
CVmFileSource::clone(CVmFileSource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  osfildef *poVar1;
  undefined8 *puVar2;
  
  poVar1 = osfdup(this->fp,(char *)__fn);
  if (poVar1 == (osfildef *)0x0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = &PTR__CVmFileSource_0031c108;
    puVar2[1] = poVar1;
  }
  return (int)puVar2;
}

Assistant:

virtual CVmDataSource *clone(VMG_ const char *mode)
    {
        /* duplicate our underlying file handle */
        osfildef *fpdup = osfdup(fp, mode);
        if (fpdup == 0)
            return 0;

        /* return a new source wrapping the duplicated file handle */
        return new CVmFileSource(fpdup);
    }